

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hacdMicroAllocator.cpp
# Opt level: O2

void * HACD::heap_malloc(HeapManager *hm,size_t size)

{
  void *pvVar1;
  
  pvVar1 = MyHeapManager::inline_heap_malloc((MyHeapManager *)(hm + -1),size);
  return pvVar1;
}

Assistant:

void * heap_malloc(HeapManager *hm,size_t size)
{
    return ((MyHeapManager *)hm)->inline_heap_malloc(size);
}